

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_libapi.cpp
# Opt level: O0

ze_result_t
zeFabricEdgeGetPropertiesExp
          (ze_fabric_edge_handle_t hEdge,ze_fabric_edge_exp_properties_t *pEdgeProperties)

{
  ze_pfnFabricEdgeGetPropertiesExp_t p_Var1;
  __pointer_type p_Var2;
  ze_pfnFabricEdgeGetPropertiesExp_t pfnGetPropertiesExp;
  ze_fabric_edge_exp_properties_t *pEdgeProperties_local;
  ze_fabric_edge_handle_t hEdge_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_ze_dditable_t_*>::load
                       ((atomic<_ze_dditable_t_*> *)(ze_lib::context + 0x10),memory_order_seq_cst);
    p_Var1 = (p_Var2->FabricEdgeExp).pfnGetPropertiesExp;
    if (p_Var1 == (ze_pfnFabricEdgeGetPropertiesExp_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hEdge_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hEdge_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hEdge_local._4_4_ = (*p_Var1)(hEdge,pEdgeProperties);
    }
  }
  else {
    hEdge_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hEdge_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zeFabricEdgeGetPropertiesExp(
    ze_fabric_edge_handle_t hEdge,                  ///< [in] handle of the fabric edge
    ze_fabric_edge_exp_properties_t* pEdgeProperties///< [in,out] query result for fabric edge properties
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const ze_pfnFabricEdgeGetPropertiesExp_t pfnGetPropertiesExp = [&result] {
        auto pfnGetPropertiesExp = ze_lib::context->zeDdiTable.load()->FabricEdgeExp.pfnGetPropertiesExp;
        if( nullptr == pfnGetPropertiesExp ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnGetPropertiesExp;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnGetPropertiesExp( hEdge, pEdgeProperties );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnGetPropertiesExp = ze_lib::context->zeDdiTable.load()->FabricEdgeExp.pfnGetPropertiesExp;
    if( nullptr == pfnGetPropertiesExp ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnGetPropertiesExp( hEdge, pEdgeProperties );
    #endif
}